

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTestShared.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::NegativeTestShared::NegativeTestContext::beginSection
          (NegativeTestContext *this,string *desc)

{
  bool bVar1;
  TestLog *this_00;
  allocator<char> local_79;
  string local_78;
  LogSection local_58;
  string *local_18;
  string *desc_local;
  NegativeTestContext *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  bVar1 = glu::CallLogWrapper::isLoggingEnabled(&this->super_CallLogWrapper);
  if (bVar1) {
    this_00 = glu::CallLogWrapper::getLog(&this->super_CallLogWrapper);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"callstream",&local_79);
    tcu::LogSection::LogSection(&local_58,&local_78,local_18);
    tcu::TestLog::operator<<(this_00,&local_58);
    tcu::LogSection::~LogSection(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    this->m_openSections = this->m_openSections + 1;
  }
  return;
}

Assistant:

void NegativeTestContext::beginSection (const string& desc)
{
	if (isLoggingEnabled())
	{
		getLog() << TestLog::Section("callstream", desc);
		m_openSections++;
	}
}